

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_pixels(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,void *data
                        ,int write_alpha,int scanline_pad,int expand_mono)

{
  uchar *d;
  int local_30;
  int j_end;
  int j;
  int i;
  stbiw_uint32 zero;
  int comp_local;
  int y_local;
  int x_local;
  int vdir_local;
  int rgb_dir_local;
  stbi__write_context *s_local;
  
  j = 0;
  if (0 < y) {
    y_local = vdir;
    if (stbi__flip_vertically_on_write != 0) {
      y_local = -vdir;
    }
    i = comp;
    zero = y;
    comp_local = x;
    x_local = rgb_dir;
    _vdir_local = s;
    if (y_local < 0) {
      d._4_4_ = -1;
      local_30 = y + -1;
    }
    else {
      local_30 = 0;
      d._4_4_ = y;
    }
    for (; local_30 != d._4_4_; local_30 = y_local + local_30) {
      for (j_end = 0; j_end < comp_local; j_end = j_end + 1) {
        stbiw__write_pixel(_vdir_local,x_local,i,write_alpha,expand_mono,
                           (uchar *)((long)data + (long)((local_30 * comp_local + j_end) * i)));
      }
      stbiw__write_flush(_vdir_local);
      (*_vdir_local->func)(_vdir_local->context,&j,scanline_pad);
    }
  }
  return;
}

Assistant:

static void stbiw__write_pixels(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, void *data, int write_alpha, int scanline_pad, int expand_mono)
{
   stbiw_uint32 zero = 0;
   int i,j, j_end;

   if (y <= 0)
      return;

   if (stbi__flip_vertically_on_write)
      vdir *= -1;

   if (vdir < 0) {
      j_end = -1; j = y-1;
   } else {
      j_end =  y; j = 0;
   }

   for (; j != j_end; j += vdir) {
      for (i=0; i < x; ++i) {
         unsigned char *d = (unsigned char *) data + (j*x+i)*comp;
         stbiw__write_pixel(s, rgb_dir, comp, write_alpha, expand_mono, d);
      }
      stbiw__write_flush(s);
      s->func(s->context, &zero, scanline_pad);
   }
}